

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_field_base.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::csharp::FieldGeneratorBase::GetStringDefaultValueInternal_abi_cxx11_
          (string *__return_storage_ptr__,FieldGeneratorBase *this,FieldDescriptor *descriptor)

{
  AlphaNum *a;
  string sStack_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_68;
  AlphaNum local_48;
  
  if ((*(string **)(descriptor + 0x40))->_M_string_length == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"\"\"",(allocator *)&local_48);
  }
  else {
    StringToBase64(&local_68,*(string **)(descriptor + 0x40));
    std::operator+(&local_c8,
                   "global::System.Text.Encoding.UTF8.GetString(global::System.Convert.FromBase64String(\""
                   ,&local_68);
    std::operator+(&local_a8,&local_c8,"\"), 0, ");
    strings::AlphaNum::AlphaNum(&local_48,*(unsigned_long *)(*(long *)(descriptor + 0x40) + 8));
    StrCat_abi_cxx11_(&sStack_e8,(protobuf *)&local_48,a);
    std::operator+(&local_88,&local_a8,&sStack_e8);
    std::operator+(__return_storage_ptr__,&local_88,")");
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&sStack_e8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_68);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FieldGeneratorBase::GetStringDefaultValueInternal(const FieldDescriptor* descriptor) {
    if (descriptor->default_value_string().empty())
        return "\"\"";
    else
      return "global::System.Text.Encoding.UTF8.GetString(global::System."
             "Convert.FromBase64String(\"" +
             StringToBase64(descriptor->default_value_string()) + "\"), 0, " + StrCat(descriptor->default_value_string().length()) + ")";
}